

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O0

size_t ContentWriteFunction(void *ptr,size_t size,size_t nmemb,void *userdata)

{
  undefined1 auVar1 [16];
  LOGGER_LOG p_Var2;
  size_t local_68;
  ulong local_60;
  ulong local_58;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  void *newBuffer;
  size_t malloc_size;
  HTTP_RESPONSE_CONTENT_BUFFER *responseContentBuffer;
  void *userdata_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  if (((userdata != (void *)0x0) && (ptr != (void *)0x0)) && (size * nmemb != 0)) {
    if ((size == 0) || (nmemb == 0)) {
      local_58 = 0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = size;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < nmemb) {
        local_60 = 0xffffffffffffffff;
      }
      else {
        local_60 = size * nmemb;
      }
      local_58 = local_60;
    }
    if (local_58 < -*(long *)((long)userdata + 8) - 1U) {
      local_68 = local_58 + *(long *)((long)userdata + 8);
    }
    else {
      local_68 = 0xffffffffffffffff;
    }
    if (local_68 == 0xffffffffffffffff) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                  ,"ContentWriteFunction",0x132,1,"Invalid buffer size");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      l = (LOGGER_LOG)realloc(*userdata,local_68);
    }
    if (l == (LOGGER_LOG)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                  ,"ContentWriteFunction",0x142,1,"Could not allocate buffer of size %lu",local_68);
      }
      *(undefined1 *)((long)userdata + 0x10) = 1;
      if (*userdata != 0) {
        free(*userdata);
        *(undefined8 *)userdata = 0;
      }
    }
    else {
      *(LOGGER_LOG *)userdata = l;
      memcpy((void *)(*userdata + *(long *)((long)userdata + 8)),ptr,size * nmemb);
      *(size_t *)((long)userdata + 8) = size * nmemb + *(long *)((long)userdata + 8);
    }
  }
  return size * nmemb;
}

Assistant:

static size_t ContentWriteFunction(void *ptr, size_t size, size_t nmemb, void *userdata)
{
    HTTP_RESPONSE_CONTENT_BUFFER* responseContentBuffer = (HTTP_RESPONSE_CONTENT_BUFFER*)userdata;
    if ((userdata != NULL) &&
        (ptr != NULL) &&
        (size * nmemb > 0))
    {
        size_t malloc_size = safe_multiply_size_t(size, nmemb);
        malloc_size = safe_add_size_t(malloc_size, responseContentBuffer->bufferSize);

        void* newBuffer;
        if (malloc_size == SIZE_MAX)
        {
            LogError("Invalid buffer size");
            newBuffer = NULL;
        }
        else
        {
            newBuffer = realloc(responseContentBuffer->buffer, malloc_size);
        }

        if (newBuffer != NULL)
        {
            responseContentBuffer->buffer = newBuffer;
            memcpy(responseContentBuffer->buffer + responseContentBuffer->bufferSize, ptr, size * nmemb);
            responseContentBuffer->bufferSize += size * nmemb;
        }
        else
        {
            LogError("Could not allocate buffer of size %lu", (unsigned long)(malloc_size));
            responseContentBuffer->error = 1;
            if (responseContentBuffer->buffer != NULL)
            {
                free(responseContentBuffer->buffer);
                responseContentBuffer->buffer = NULL;
            }
        }
    }

    return size * nmemb;
}